

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_2,_0>::updatePartialsByPartition
          (BeagleCPUImpl<double,_2,_0> *this,int *operations,int count)

{
  undefined4 in_EDX;
  undefined8 in_RSI;
  long *in_RDI;
  bool byPartition;
  int returnCode;
  undefined4 local_18;
  
  if ((*(byte *)((long)in_RDI + 0x13c) & 1) == 0) {
    local_18 = (**(code **)(*in_RDI + 0x1a0))(in_RDI,1,in_RSI,in_EDX,0xffffffff);
  }
  else {
    local_18 = (**(code **)(*in_RDI + 0x1f8))(in_RDI,in_RSI,in_EDX);
  }
  return local_18;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::updatePartialsByPartition(const int* operations,
                                                                 int count) {

    int returnCode = BEAGLE_ERROR_GENERAL;

    if (kThreadingEnabled) {
        returnCode = upPartialsByPartitionAsync(operations,
                                                count);
    } else {
        bool byPartition = true;
        returnCode = upPartials(byPartition,
                                operations,
                                count,
                                BEAGLE_OP_NONE);
    }

    return returnCode;
}